

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O0

int __thiscall Fl_Image::fail(Fl_Image *this)

{
  Fl_Image *this_local;
  
  if (((this->w_ < 1) || (this->h_ < 1)) || (this->d_ < 1)) {
    if (this->ld_ == 0) {
      this_local._4_4_ = -1;
    }
    else {
      this_local._4_4_ = this->ld_;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Image::fail()
{
    // if no image exists, ld_ may contain a simple error code
    if ( (w_<=0) || (h_<=0) || (d_<=0) ) {
        if (ld_==0)
            return ERR_NO_IMAGE;
        else
            return ld_;
    }
    return 0;
}